

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void getBytes(istream *stream,size_t count,string *out)

{
  char cVar1;
  undefined1 local_29;
  undefined8 local_28;
  size_t i;
  string *out_local;
  size_t count_local;
  istream *stream_local;
  
  local_28 = 0;
  while( true ) {
    local_29 = 0;
    if (local_28 < count) {
      local_29 = std::ios::good();
    }
    if ((local_29 & 1) == 0) break;
    cVar1 = std::istream::get();
    std::__cxx11::string::operator+=((string *)out,cVar1);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void getBytes( istream& stream, const size_t count, string& out ){
    for( size_t i = 0; i < count && stream.good(); ++i ){
        out += (char)stream.get();
    }
}